

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

void png_print_info(png_t *png)

{
  char *pcVar1;
  long in_RDI;
  
  printf("PNG INFO:\n");
  printf("\twidth:\t\t%d\n",(ulong)*(uint *)(in_RDI + 0x2c));
  printf("\theight:\t\t%d\n",(ulong)*(uint *)(in_RDI + 0x30));
  printf("\tdepth:\t\t%d\n",(ulong)*(byte *)(in_RDI + 0x34));
  printf("\tcolor:\t\t");
  switch(*(undefined1 *)(in_RDI + 0x35)) {
  case 0:
    printf("greyscale\n");
    break;
  default:
    printf("unknown, this is not good\n");
    break;
  case 2:
    printf("truecolor\n");
    break;
  case 3:
    printf("palette\n");
    break;
  case 4:
    printf("greyscale with alpha\n");
    break;
  case 6:
    printf("truecolor with alpha\n");
  }
  pcVar1 = "inflate/deflate";
  if (*(char *)(in_RDI + 0x36) != '\0') {
    pcVar1 = "unknown, this is not good";
  }
  printf("\tcompression:\t%s\n",pcVar1);
  pcVar1 = "adaptive";
  if (*(char *)(in_RDI + 0x37) != '\0') {
    pcVar1 = "unknown, this is not good";
  }
  printf("\tfilter:\t\t%s\n",pcVar1);
  pcVar1 = "no interlace";
  if (*(char *)(in_RDI + 0x38) != '\0') {
    pcVar1 = "interlace";
  }
  printf("\tinterlace:\t%s\n",pcVar1);
  return;
}

Assistant:

void png_print_info(png_t* png)
{
	printf("PNG INFO:\n");
	printf("\twidth:\t\t%d\n", png->width);
	printf("\theight:\t\t%d\n", png->height);
	printf("\tdepth:\t\t%d\n", png->depth);
	printf("\tcolor:\t\t");

	switch(png->color_type)
	{
	case PNG_GREYSCALE:			printf("greyscale\n"); break;
	case PNG_TRUECOLOR:			printf("truecolor\n"); break;
	case PNG_INDEXED:			printf("palette\n"); break;
	case PNG_GREYSCALE_ALPHA:	printf("greyscale with alpha\n"); break;
	case PNG_TRUECOLOR_ALPHA:	printf("truecolor with alpha\n"); break;
	default:					printf("unknown, this is not good\n"); break;
	}

	printf("\tcompression:\t%s\n",	png->compression_method?"unknown, this is not good":"inflate/deflate");
	printf("\tfilter:\t\t%s\n",		png->filter_method?"unknown, this is not good":"adaptive");
	printf("\tinterlace:\t%s\n",	png->interlace_method?"interlace":"no interlace");
}